

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * mg_get_option(mg_context *ctx,char *name)

{
  int iVar1;
  int i;
  char *name_local;
  mg_context *ctx_local;
  
  iVar1 = get_option_index(name);
  if (iVar1 == -1) {
    ctx_local = (mg_context *)0x0;
  }
  else if ((ctx == (mg_context *)0x0) || ((ctx->dd).config[iVar1] == (char *)0x0)) {
    ctx_local = (mg_context *)0x16ccc7;
  }
  else {
    ctx_local = (mg_context *)(ctx->dd).config[iVar1];
  }
  return (char *)ctx_local;
}

Assistant:

CIVETWEB_API const char *
mg_get_option(const struct mg_context *ctx, const char *name)
{
	int i;
	if ((i = get_option_index(name)) == -1) {
		return NULL;
	} else if (!ctx || ctx->dd.config[i] == NULL) {
		return "";
	} else {
		return ctx->dd.config[i];
	}
}